

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirementsForOperand
          (TrimCapabilitiesPass *this,Operand *operand,CapabilitySet *capabilities,
          ExtensionSet *extensions)

{
  CapabilitySet *pCVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  spv_operand_desc psVar3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  spv_result_t sVar7;
  size_t sVar8;
  uint **ppuVar9;
  Extension *pEVar10;
  uint **ppuVar11;
  uint32_t i;
  int iVar12;
  uint32_t i_1;
  ulong uVar13;
  long lVar14;
  spv_operand_desc_t *desc;
  Capability capability;
  spv_operand_desc local_88;
  Capability local_7c;
  ExtensionSet *local_78;
  TrimCapabilitiesPass *local_70;
  EnumSet<spv::Capability> *local_68;
  Operand *local_60;
  uint **local_58;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  pvVar2 = (operand->words).large_data_._M_t.
           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
           ._M_head_impl;
  if (pvVar2 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    sVar8 = (operand->words).size_;
  }
  else {
    sVar8 = (long)*(pointer *)
                   ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl + 8) -
            *(long *)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl >> 2;
  }
  if (((sVar8 == 1) &&
      (uVar5 = operand->type - SPV_OPERAND_TYPE_ID,
      uVar5 = uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f, 1 < uVar5)) && (uVar5 != 5)) {
    local_68 = capabilities;
    if ((uVar5 == 2) &&
       (this_00.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               *)&(((((this->super_Pass).context_)->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                  memory_model_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       , this_00.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
         (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0)) {
      uVar5 = (*(bool *)((long)this_00.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 0x2d) & 1) + 1;
      if (*(bool *)((long)this_00.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                   0x2c) == false) {
        uVar5 = (uint)*(bool *)((long)this_00.
                                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                      _M_head_impl + 0x2d);
      }
      uVar6 = Instruction::GetSingleWordOperand
                        ((Instruction *)
                         this_00.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                         uVar5 + 1);
      if (uVar6 == 3) {
        local_88 = (spv_operand_desc)CONCAT44(local_88._4_4_,0x14e2);
        EnumSet<spv::Capability>::insert(&local_50,local_68,(Capability *)&local_88);
      }
    }
    bVar4 = spvOperandIsConcreteMask(operand->type);
    local_70 = this;
    if (bVar4) {
      local_58 = &(operand->words).small_data_;
      pCVar1 = &this->supportedCapabilities_;
      iVar12 = 0;
      local_78 = extensions;
      local_60 = operand;
      do {
        ppuVar9 = (uint **)(operand->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        if (ppuVar9 == (uint **)0x0) {
          ppuVar9 = local_58;
        }
        uVar5 = 1 << ((byte)iVar12 & 0x1f) & **ppuVar9;
        if (uVar5 != 0) {
          local_88 = (spv_operand_desc)0x0;
          sVar7 = AssemblyGrammar::lookupOperand
                            (&((this->super_Pass).context_)->grammar_,operand->type,uVar5,&local_88)
          ;
          psVar3 = local_88;
          operand = local_60;
          this = local_70;
          if (sVar7 == SPV_SUCCESS) {
            uVar5 = local_88->numCapabilities;
            if ((ulong)uVar5 != 0) {
              uVar13 = 0;
              do {
                local_7c = psVar3->capabilities[uVar13];
                bVar4 = EnumSet<spv::Capability>::contains(pCVar1,local_7c);
                if (bVar4) {
                  EnumSet<spv::Capability>::insert(&local_50,local_68,&local_7c);
                }
                uVar13 = uVar13 + 1;
                extensions = local_78;
              } while (uVar5 != uVar13);
            }
            psVar3 = local_88;
            uVar5 = local_88->minVersion;
            uVar6 = spvVersionForTargetEnv
                              (((local_70->super_Pass).context_)->syntax_context_->target_env);
            operand = local_60;
            this = local_70;
            if ((uVar6 < uVar5) && (uVar13 = (ulong)psVar3->numExtensions, uVar13 != 0)) {
              pEVar10 = psVar3->extensions;
              lVar14 = uVar13 << 2;
              do {
                EnumSet<spvtools::Extension>::insert
                          ((pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> *)&local_50
                           ,extensions,pEVar10);
                pEVar10 = pEVar10 + 1;
                lVar14 = lVar14 + -4;
                operand = local_60;
                this = local_70;
              } while (lVar14 != 0);
            }
          }
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0x20);
    }
    else {
      local_88 = (spv_operand_desc)0x0;
      ppuVar9 = (uint **)(operand->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar11 = &(operand->words).small_data_;
      if (ppuVar9 != (uint **)0x0) {
        ppuVar11 = ppuVar9;
      }
      sVar7 = AssemblyGrammar::lookupOperand
                        (&((this->super_Pass).context_)->grammar_,operand->type,**ppuVar11,&local_88
                        );
      psVar3 = local_88;
      if (sVar7 == SPV_SUCCESS) {
        uVar5 = local_88->numCapabilities;
        if ((ulong)uVar5 != 0) {
          pCVar1 = &this->supportedCapabilities_;
          uVar13 = 0;
          local_78 = extensions;
          do {
            local_7c = psVar3->capabilities[uVar13];
            bVar4 = EnumSet<spv::Capability>::contains(pCVar1,local_7c);
            if (bVar4) {
              EnumSet<spv::Capability>::insert(&local_50,local_68,&local_7c);
            }
            uVar13 = uVar13 + 1;
            extensions = local_78;
            this = local_70;
          } while (uVar5 != uVar13);
        }
        psVar3 = local_88;
        uVar5 = local_88->minVersion;
        uVar6 = spvVersionForTargetEnv(((this->super_Pass).context_)->syntax_context_->target_env);
        if ((uVar6 < uVar5) && (uVar13 = (ulong)psVar3->numExtensions, uVar13 != 0)) {
          pEVar10 = psVar3->extensions;
          lVar14 = uVar13 << 2;
          do {
            EnumSet<spvtools::Extension>::insert
                      ((pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> *)&local_50,
                       extensions,pEVar10);
            pEVar10 = pEVar10 + 1;
            lVar14 = lVar14 + -4;
          } while (lVar14 != 0);
        }
      }
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::addInstructionRequirementsForOperand(
    const Operand& operand, CapabilitySet* capabilities,
    ExtensionSet* extensions) const {
  // No supported capability relies on a 2+-word operand.
  if (operand.words.size() != 1) {
    return;
  }

  // No supported capability relies on a literal string operand or an ID.
  if (operand.type == SPV_OPERAND_TYPE_LITERAL_STRING ||
      operand.type == SPV_OPERAND_TYPE_ID ||
      operand.type == SPV_OPERAND_TYPE_RESULT_ID) {
    return;
  }

  // If the Vulkan memory model is declared and any instruction uses Device
  // scope, the VulkanMemoryModelDeviceScope capability must be declared. This
  // rule cannot be covered by the grammar, so must be checked explicitly.
  if (operand.type == SPV_OPERAND_TYPE_SCOPE_ID) {
    const Instruction* memory_model = context()->GetMemoryModel();
    if (memory_model && memory_model->GetSingleWordInOperand(1u) ==
                            uint32_t(spv::MemoryModel::Vulkan)) {
      capabilities->insert(spv::Capability::VulkanMemoryModelDeviceScope);
    }
  }

  // case 1: Operand is a single value, can directly lookup.
  if (!spvOperandIsConcreteMask(operand.type)) {
    const spv_operand_desc_t* desc = {};
    auto result = context()->grammar().lookupOperand(operand.type,
                                                     operand.words[0], &desc);
    if (result != SPV_SUCCESS) {
      return;
    }
    addSupportedCapabilitiesToSet(desc, capabilities);
    addSupportedExtensionsToSet(desc, extensions);
    return;
  }

  // case 2: operand can be a bitmask, we need to decompose the lookup.
  for (uint32_t i = 0; i < 32; i++) {
    const uint32_t mask = (1 << i) & operand.words[0];
    if (!mask) {
      continue;
    }

    const spv_operand_desc_t* desc = {};
    auto result = context()->grammar().lookupOperand(operand.type, mask, &desc);
    if (result != SPV_SUCCESS) {
      continue;
    }

    addSupportedCapabilitiesToSet(desc, capabilities);
    addSupportedExtensionsToSet(desc, extensions);
  }
}